

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::setJointLimits
          (InverseKinematics *this,Span<const_double,__1L> jointLimitsMin,
          Span<const_double,__1L> jointLimitsMax)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::setJointLimits(iDynTree::Span<const double> jointLimitsMin, iDynTree::Span<const double> jointLimitsMax)
    {
#ifdef IDYNTREE_USES_IPOPT
      assert(m_pimpl);
      return IK_PIMPL(m_pimpl)->setJointLimits(jointLimitsMin, jointLimitsMax);
#else
        return missingIpoptErrorReport();
#endif
    }